

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O2

uint32 __thiscall
Js::WebAssemblyEnvironment::GetDataSegmentOffset(WebAssemblyEnvironment *this,uint32 index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->offsetInitialized == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                                ,0xf5,"(offsetInitialized)","offsetInitialized");
    if (!bVar2) goto LAB_00c17de9;
    *puVar3 = 0;
  }
  if (index < ((this->module).ptr)->m_datasegCount) {
    return this->dataSegmentOffsets[index];
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyEnvironment.cpp"
                              ,0xf8,"((0))","We should only be using valid indexes");
  if (bVar2) {
    *puVar3 = 0;
    JavascriptError::ThrowRangeError
              ((((((((this->module).ptr)->super_DynamicObject).super_RecyclableObject.type.ptr)->
                 javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebf6
               ,(PCWSTR)0x0);
  }
LAB_00c17de9:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

uint32 WebAssemblyEnvironment::GetDataSegmentOffset(uint32 index) const
{
    Assert(offsetInitialized);
    if (index >= module->GetDataSegCount())
    {
        AssertMsg(UNREACHED, "We should only be using valid indexes");
        JavascriptError::ThrowRangeError(module->GetScriptContext(), JSERR_ArgumentOutOfRange);
    }
    return dataSegmentOffsets[index];
}